

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryLambdaWrapper,bool,duckdb::dtime_tz_t(*)(duckdb::interval_t,duckdb::dtime_tz_t),false,true>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,_func_dtime_tz_t_interval_t_dtime_tz_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  dtime_tz_t dVar9;
  dtime_tz_t dVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int64_t *piVar15;
  idx_t iVar16;
  ulong uVar17;
  interval_t iVar18;
  interval_t iVar19;
  interval_t iVar20;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar10 = (dtime_tz_t)rdata->bits;
      piVar15 = &ldata->micros;
      iVar16 = 0;
      do {
        uVar3 = ((interval_t *)(piVar15 + -1))->months;
        uVar8 = ((interval_t *)(piVar15 + -1))->days;
        iVar20.days = uVar8;
        iVar20.months = uVar3;
        iVar20.micros = *piVar15;
        dVar9 = (*fun)(iVar20,dVar10);
        result_data[iVar16].bits = dVar9.bits;
        iVar16 = iVar16 + 1;
        piVar15 = piVar15 + 2;
      } while (count != iVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar11 = 0;
    uVar14 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
LAB_01a3c89a:
        uVar13 = uVar14;
        if (uVar14 < uVar12) {
          dVar10 = (dtime_tz_t)rdata->bits;
          piVar15 = &ldata[uVar14].micros;
          do {
            uVar1 = ((interval_t *)(piVar15 + -1))->months;
            uVar6 = ((interval_t *)(piVar15 + -1))->days;
            iVar18.days = uVar6;
            iVar18.months = uVar1;
            iVar18.micros = *piVar15;
            dVar9 = (*fun)(iVar18,dVar10);
            result_data[uVar14].bits = dVar9.bits;
            uVar14 = uVar14 + 1;
            piVar15 = piVar15 + 2;
            uVar13 = uVar12;
          } while (uVar12 != uVar14);
        }
      }
      else {
        uVar5 = puVar4[uVar11];
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
        uVar13 = uVar12;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) goto LAB_01a3c89a;
          uVar13 = uVar14;
          if (uVar14 < uVar12) {
            piVar15 = &ldata[uVar14].micros;
            uVar17 = 0;
            do {
              if ((uVar5 >> (uVar17 & 0x3f) & 1) != 0) {
                uVar2 = ((interval_t *)(piVar15 + -1))->months;
                uVar7 = ((interval_t *)(piVar15 + -1))->days;
                iVar19.days = uVar7;
                iVar19.months = uVar2;
                iVar19.micros = *piVar15;
                dVar10 = (*fun)(iVar19,rdata->bits);
                result_data[uVar14 + uVar17].bits = dVar10.bits;
              }
              uVar17 = uVar17 + 1;
              piVar15 = piVar15 + 2;
              uVar13 = uVar12;
            } while (uVar12 - uVar14 != uVar17);
          }
        }
      }
      uVar11 = uVar11 + 1;
      uVar14 = uVar13;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}